

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O0

int __thiscall ncnn::Padding::load_model(Padding *this,ModelBin *mb)

{
  int *piVar1;
  void **ppvVar2;
  long *in_RSI;
  long in_RDI;
  void *local_d0;
  int *local_c8;
  long *local_b0;
  int local_78;
  undefined4 local_74;
  void **local_70;
  void **local_68;
  void **local_60;
  void **local_58;
  int local_38;
  undefined4 local_34;
  void **local_30;
  int local_28;
  undefined4 local_24;
  void **local_20;
  void *local_18;
  
  if (*(int *)(in_RDI + 0xf0) != 0) {
    (**(code **)(*in_RSI + 0x10))(&local_d0,in_RSI,*(undefined4 *)(in_RDI + 0xf0),1);
    ppvVar2 = (void **)(in_RDI + 0xf8);
    local_70 = &local_d0;
    local_68 = ppvVar2;
    if (ppvVar2 != local_70) {
      if (local_c8 != (int *)0x0) {
        local_74 = 1;
        LOCK();
        local_78 = *local_c8;
        *local_c8 = *local_c8 + 1;
        UNLOCK();
      }
      local_20 = ppvVar2;
      if (*(long *)(in_RDI + 0x100) != 0) {
        piVar1 = *(int **)(in_RDI + 0x100);
        local_24 = 0xffffffff;
        LOCK();
        local_28 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_28 == 1) {
          if (*(long *)(in_RDI + 0x118) == 0) {
            local_18 = *ppvVar2;
            if (local_18 != (void *)0x0) {
              free(local_18);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x118) + 0x18))(*(long **)(in_RDI + 0x118),*ppvVar2);
          }
        }
      }
      *ppvVar2 = (void *)0x0;
      *(undefined8 *)(in_RDI + 0x108) = 0;
      *(undefined4 *)(in_RDI + 0x110) = 0;
      *(undefined4 *)(in_RDI + 0x120) = 0;
      *(undefined4 *)(in_RDI + 0x124) = 0;
      *(undefined4 *)(in_RDI + 0x128) = 0;
      *(undefined4 *)(in_RDI + 300) = 0;
      *(undefined4 *)(in_RDI + 0x130) = 0;
      *(undefined8 *)(in_RDI + 0x138) = 0;
      *(undefined8 *)(in_RDI + 0x100) = 0;
      *ppvVar2 = *local_70;
      *(void **)(in_RDI + 0x100) = local_70[1];
      *(void **)(in_RDI + 0x108) = local_70[2];
      *(undefined4 *)(in_RDI + 0x110) = *(undefined4 *)(local_70 + 3);
      *(void **)(in_RDI + 0x118) = local_70[4];
      *(undefined4 *)(in_RDI + 0x120) = *(undefined4 *)(local_70 + 5);
      *(undefined4 *)(in_RDI + 0x124) = *(undefined4 *)((long)local_70 + 0x2c);
      *(undefined4 *)(in_RDI + 0x128) = *(undefined4 *)(local_70 + 6);
      *(undefined4 *)(in_RDI + 300) = *(undefined4 *)((long)local_70 + 0x34);
      *(undefined4 *)(in_RDI + 0x130) = *(undefined4 *)(local_70 + 7);
      *(void **)(in_RDI + 0x138) = local_70[8];
    }
    local_58 = &local_d0;
    if (local_c8 != (int *)0x0) {
      local_34 = 0xffffffff;
      LOCK();
      local_38 = *local_c8;
      *local_c8 = *local_c8 + -1;
      UNLOCK();
      if (local_38 == 1) {
        local_60 = ppvVar2;
        local_30 = local_58;
        if (local_b0 == (long *)0x0) {
          if (local_d0 != (void *)0x0) {
            free(local_d0);
          }
        }
        else {
          (**(code **)(*local_b0 + 0x18))(local_b0,local_d0);
        }
      }
    }
  }
  return 0;
}

Assistant:

int Padding::load_model(const ModelBin& mb)
{
    if (per_channel_pad_data_size)
    {
        per_channel_pad_data = mb.load(per_channel_pad_data_size, 1);
    }

    return 0;
}